

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

void __thiscall cmState::Directory::ComputeRelativePathTopBinary(Directory *this)

{
  bool bVar1;
  char *pcVar2;
  PointerType pBVar3;
  Snapshot *this_00;
  allocator local_c9;
  vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_> snapshots;
  string result;
  undefined1 local_90 [40];
  Snapshot snapshot;
  string currentBinary;
  
  snapshot.Position.Position = (this->Snapshot_).Position.Position;
  snapshot.State = (this->Snapshot_).State;
  snapshot.Position.Tree = (this->Snapshot_).Position.Tree;
  snapshots.super__Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  snapshots.super__Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  snapshots.super__Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>::push_back
            (&snapshots,&snapshot);
  while( true ) {
    Snapshot::GetBuildsystemDirectoryParent((Snapshot *)local_90,&snapshot);
    snapshot.Position.Position = local_90._16_8_;
    snapshot.State = (cmState *)local_90._0_8_;
    snapshot.Position.Tree = (cmLinkedTree<cmState::SnapshotDataType> *)local_90._8_8_;
    bVar1 = Snapshot::IsValid(&snapshot);
    if (!bVar1) break;
    std::vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>::push_back
              (&snapshots,&snapshot);
  }
  Snapshot::GetDirectory
            ((Directory *)local_90,
             snapshots.super__Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>.
             _M_impl.super__Vector_impl_data._M_start);
  pcVar2 = GetCurrentBinary((Directory *)local_90);
  std::__cxx11::string::string((string *)&result,pcVar2,(allocator *)&currentBinary);
  this_00 = snapshots.super__Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>.
            _M_impl.super__Vector_impl_data._M_start;
  while (this_00 = this_00 + 1,
        this_00 !=
        snapshots.super__Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>._M_impl.
        super__Vector_impl_data._M_finish) {
    Snapshot::GetDirectory((Directory *)local_90,this_00);
    pcVar2 = GetCurrentBinary((Directory *)local_90);
    std::__cxx11::string::string((string *)&currentBinary,pcVar2,&local_c9);
    bVar1 = cmsys::SystemTools::IsSubDirectory(&result,&currentBinary);
    if (bVar1) {
      std::__cxx11::string::_M_assign((string *)&result);
    }
    std::__cxx11::string::~string((string *)&currentBinary);
  }
  if (1 < result._M_string_length) {
    std::__cxx11::string::substr((ulong)local_90,(ulong)&result);
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_90,"//");
    std::__cxx11::string::~string((string *)local_90);
    if (!bVar1) {
      pBVar3 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                         (&this->DirectoryState);
      std::__cxx11::string::assign((char *)&pBVar3->RelativePathTopBinary);
      goto LAB_002a3e63;
    }
  }
  pBVar3 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                     (&this->DirectoryState);
  std::__cxx11::string::_M_assign((string *)&pBVar3->RelativePathTopBinary);
LAB_002a3e63:
  std::__cxx11::string::~string((string *)&result);
  std::_Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>::~_Vector_base
            (&snapshots.super__Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>);
  return;
}

Assistant:

void cmState::Directory::ComputeRelativePathTopBinary()
{
  cmState::Snapshot snapshot = this->Snapshot_;
  std::vector<cmState::Snapshot> snapshots;
  snapshots.push_back(snapshot);
  while (true)
    {
    snapshot = snapshot.GetBuildsystemDirectoryParent();
    if (snapshot.IsValid())
      {
      snapshots.push_back(snapshot);
      }
    else
      {
      break;
      }
    }

  std::string result =
      snapshots.front().GetDirectory().GetCurrentBinary();

  for (std::vector<cmState::Snapshot>::const_iterator it =
       snapshots.begin() + 1; it != snapshots.end(); ++it)
    {
    std::string currentBinary = it->GetDirectory().GetCurrentBinary();
    if(cmSystemTools::IsSubDirectory(result, currentBinary))
      {
      result = currentBinary;
      }
    }

  // The current working directory on Windows cannot be a network
  // path.  Therefore relative paths cannot work when the binary tree
  // is a network path.
  if(result.size() < 2 || result.substr(0, 2) != "//")
    {
    this->DirectoryState->RelativePathTopBinary = result;
    }
  else
    {
    this->DirectoryState->RelativePathTopBinary = "";
    }
}